

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGC.cpp
# Opt level: O1

void __thiscall
Test_testGarbageCollectionCorrectness17::~Test_testGarbageCollectionCorrectness17
          (Test_testGarbageCollectionCorrectness17 *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

const char	*testGarbageCollectionCorrectness18 =
"import std.gc;\r\n\
class Data extendable\r\n\
{\r\n\
	int get(){ return boring; }\r\n\
	int boring;\r\n\
}\r\n\
class HiddenData : Data\r\n\
{\r\n\
	void HiddenData(int x){ value = new int(x); }\r\n\
	int get(){ return *value; }